

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_memcasecmp(void *s1,void *s2,size_t len)

{
  byte bVar1;
  uchar *n2;
  uchar *n1;
  ulong uStack_30;
  uchar diff;
  size_t i;
  size_t len_local;
  void *s2_local;
  void *s1_local;
  
  uStack_30 = 0;
  while( true ) {
    if (len <= uStack_30) {
      return 0;
    }
    bVar1 = *(byte *)((long)s1 + uStack_30) ^ *(byte *)((long)s2 + uStack_30);
    if ((bVar1 != 0) &&
       ((bVar1 != 0x20 ||
        (((*(byte *)((long)s1 + uStack_30) < 0x61 || (0x7a < *(byte *)((long)s1 + uStack_30))) &&
         ((*(byte *)((long)s1 + uStack_30) < 0x41 || (0x5a < *(byte *)((long)s1 + uStack_30)))))))))
    break;
    uStack_30 = uStack_30 + 1;
  }
  return -1;
}

Assistant:

static int x509_memcasecmp( const void *s1, const void *s2, size_t len )
{
    size_t i;
    unsigned char diff;
    const unsigned char *n1 = s1, *n2 = s2;

    for( i = 0; i < len; i++ )
    {
        diff = n1[i] ^ n2[i];

        if( diff == 0 )
            continue;

        if( diff == 32 &&
            ( ( n1[i] >= 'a' && n1[i] <= 'z' ) ||
              ( n1[i] >= 'A' && n1[i] <= 'Z' ) ) )
        {
            continue;
        }

        return( -1 );
    }

    return( 0 );
}